

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIndexEnumerator.cpp
# Opt level: O2

void __thiscall
Js::JavascriptArrayIndexEnumerator::JavascriptArrayIndexEnumerator
          (JavascriptArrayIndexEnumerator *this,JavascriptArray *arrayObject,EnumeratorFlags flags,
          ScriptContext *scriptContext)

{
  JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase
            (&this->super_JavascriptArrayIndexEnumeratorBase,arrayObject,flags,scriptContext);
  (this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.super_RecyclableObject
  .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01394b30;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(arrayObject);
  (*(this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x62])(this);
  return;
}

Assistant:

JavascriptArrayIndexEnumerator::JavascriptArrayIndexEnumerator(
        JavascriptArray* arrayObject, EnumeratorFlags flags, ScriptContext* scriptContext) :
        JavascriptArrayIndexEnumeratorBase(arrayObject, flags, scriptContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayObject);
#endif
        Reset();
    }